

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_CustomModel_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/CustomModel.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
            ((CustomModel_CustomModelParamValue *)
             &_CustomModel_CustomModelParamValue_default_instance_);
  DAT_003cbb08 = 1;
  DAT_003cbb48 = (undefined8 *)0x0;
  _DAT_003cbb50 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003cbb58 = (undefined8 *)0x0;
  uRam00000000003cbb60 = 0;
  _DAT_003cbb68 = 0;
  _CustomModel_ParametersEntry_default_instance_ = &PTR__MapEntryImpl_003c5308;
  DAT_003cbb70 = 1;
  CustomModel::CustomModel((CustomModel *)&_CustomModel_default_instance_);
  DAT_003cbbc0 = 1;
  DAT_003cbb48 = &_CustomModel_ParametersEntry_default_instance_;
  DAT_003cbb58 = &_CustomModel_CustomModelParamValue_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _CustomModel_CustomModelParamValue_default_instance_.DefaultConstruct();
  _CustomModel_ParametersEntry_default_instance_.DefaultConstruct();
  _CustomModel_default_instance_.DefaultConstruct();
  _CustomModel_ParametersEntry_default_instance_.get_mutable()->set_default_instance(_CustomModel_ParametersEntry_default_instance_.get_mutable());
  _CustomModel_ParametersEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
}